

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O1

void __thiscall
MobileElement::MobileElement(MobileElement *this,string *name,int footprint,double speed)

{
  string *__rhs;
  pointer pcVar1;
  invalid_argument *piVar2;
  long *plVar3;
  long *plVar4;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->super_enable_shared_from_this<MobileElement>)._M_weak_this.
  super___weak_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<MobileElement>)._M_weak_this.
  super___weak_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_MobileElement = (_func_int **)&PTR___cxa_pure_virtual_001a7450;
  __rhs = &this->name_;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)__rhs,pcVar1,pcVar1 + name->_M_string_length);
  this->footprint_ = footprint;
  this->speed_ = speed;
  this->reading_frame_ = -1;
  (this->gene_bound_)._M_dataplus._M_p = (pointer)&(this->gene_bound_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->gene_bound_,"");
  this->polymerasereadthrough_ = false;
  this->start_ = 0;
  this->stop_ = this->footprint_;
  if (this->footprint_ < 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"Mobile element \'",__rhs);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = (long *)*plVar3;
    plVar4 = plVar3 + 2;
    if (local_70 == plVar4) {
      local_60 = *plVar4;
      lStack_58 = plVar3[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar4;
    }
    local_68 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::invalid_argument::invalid_argument(piVar2,(string *)&local_70);
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (0.0 < this->speed_ || this->speed_ == 0.0) {
    return;
  }
  piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"Mobile element \'",__rhs);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_70 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::invalid_argument::invalid_argument(piVar2,(string *)&local_70);
  __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

MobileElement::MobileElement(const std::string &name, int footprint, double speed)
    : name_(name), footprint_(footprint), speed_(speed), reading_frame_(-1) {
  start_ = 0;
  stop_ = start_ + footprint_;
  if (footprint_ < 0) {
    throw std::invalid_argument("Mobile element '" + name_ +
                                "' has a negative footprint size.");
  }
  if (speed_ < 0) {
    throw std::invalid_argument("Mobile element '" + name_ +
                                "' has a negative average speed.");
  }
}